

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStringObject.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptStringObject::IsWritable(JavascriptStringObject *this,PropertyId propertyId)

{
  bool bVar1;
  PropertyQueryFlags val;
  BOOL BVar2;
  PropertyId propertyId_local;
  JavascriptStringObject *this_local;
  
  if (propertyId == 0xd1) {
    this_local._4_4_ = 0;
  }
  else {
    val = DynamicObject::HasPropertyQuery
                    (&this->super_DynamicObject,propertyId,(PropertyValueInfo *)0x0);
    BVar2 = JavascriptConversion::PropertyQueryFlagsToBoolean(val);
    if (BVar2 == 0) {
      bVar1 = IsValidIndex(this,propertyId,false);
      this_local._4_4_ = (uint)bVar1;
    }
    else {
      this_local._4_4_ = DynamicObject::IsWritable(&this->super_DynamicObject,propertyId);
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptStringObject::IsWritable(PropertyId propertyId)
    {
        if (propertyId == PropertyIds::length)
        {
            return false;
        }

        // From DynamicObject::IsWritable we can't tell if the result is from a property or just default
        // value. Call HasProperty to find out.
        if (JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::HasPropertyQuery(propertyId, nullptr /*info*/)))
        {
            return DynamicObject::IsWritable(propertyId);
        }

        return JavascriptStringObject::IsValidIndex(propertyId, false);
    }